

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O3

void __thiscall
ZoneHashEntryLink::ZoneHashEntryLink
          (ZoneHashEntryLink *this,char *str,size_t len,int copy,ZoneHashEntry *link_to)

{
  int iVar1;
  undefined4 extraout_var;
  
  CVmHashEntry::CVmHashEntry((CVmHashEntry *)this,str,len,copy);
  (this->super_ZoneHashEntry).tz = (CVmTimeZone *)0x0;
  *(undefined4 *)&(this->super_ZoneHashEntry).super_CVmHashEntryCI.super_CVmHashEntry.field_0x24 = 2
  ;
  (this->super_ZoneHashEntry).link_from = (ZoneHashEntryLink *)0x0;
  (this->super_ZoneHashEntry).nxt = (ZoneHashEntry *)0x0;
  (this->super_ZoneHashEntry).super_CVmHashEntryCI.super_CVmHashEntry._vptr_CVmHashEntry =
       (_func_int **)&PTR__ZoneHashEntry_00364c90;
  iVar1 = (*(link_to->super_CVmHashEntryCI).super_CVmHashEntry._vptr_CVmHashEntry[3])(link_to);
  this->link_to = (ZoneHashEntry *)CONCAT44(extraout_var,iVar1);
  this->link_nxt = link_to->link_from;
  ((ZoneHashEntry *)CONCAT44(extraout_var,iVar1))->link_from = this;
  return;
}

Assistant:

ZoneHashEntryLink(const char *str, size_t len, int copy,
                      ZoneHashEntry *link_to)
        : ZoneHashEntry(str, len, copy, ZONE_HASH_LINK)
    {
        /* add myself to the target's 'from' list */
        this->link_to = link_to->resolve_links();
        link_nxt = link_to->link_from;
        this->link_to->link_from = this;
    }